

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 serialGet(uchar *buf,u32 serial_type,Mem *pMem)

{
  u16 uVar1;
  int iVar2;
  MemValue MVar3;
  u32 y;
  u64 x;
  Mem *pMem_local;
  u32 serial_type_local;
  uchar *buf_local;
  
  MVar3._0_4_ = (uint)buf[4] << 0x18 | (uint)buf[5] << 0x10 | (uint)buf[6] << 8 | (uint)buf[7];
  MVar3.i._4_4_ = (uint)*buf << 0x18 | (uint)buf[1] << 0x10 | (uint)buf[2] << 8 | (uint)buf[3];
  if (serial_type == 6) {
    pMem->u = MVar3;
    pMem->flags = 4;
  }
  else {
    pMem->u = MVar3;
    iVar2 = sqlite3IsNaN((pMem->u).r);
    uVar1 = 8;
    if (iVar2 != 0) {
      uVar1 = 1;
    }
    pMem->flags = uVar1;
  }
  return 8;
}

Assistant:

static u32 SQLITE_NOINLINE serialGet(
  const unsigned char *buf,     /* Buffer to deserialize from */
  u32 serial_type,              /* Serial type to deserialize */
  Mem *pMem                     /* Memory cell to write value into */
){
  u64 x = FOUR_BYTE_UINT(buf);
  u32 y = FOUR_BYTE_UINT(buf+4);
  x = (x<<32) + y;
  if( serial_type==6 ){
    /* EVIDENCE-OF: R-29851-52272 Value is a big-endian 64-bit
    ** twos-complement integer. */
    pMem->u.i = *(i64*)&x;
    pMem->flags = MEM_Int;
    testcase( pMem->u.i<0 );
  }else{
    /* EVIDENCE-OF: R-57343-49114 Value is a big-endian IEEE 754-2008 64-bit
    ** floating point number. */
#if !defined(NDEBUG) && !defined(SQLITE_OMIT_FLOATING_POINT)
    /* Verify that integers and floating point values use the same
    ** byte order.  Or, that if SQLITE_MIXED_ENDIAN_64BIT_FLOAT is
    ** defined that 64-bit floating point values really are mixed
    ** endian.
    */
    static const u64 t1 = ((u64)0x3ff00000)<<32;
    static const double r1 = 1.0;
    u64 t2 = t1;
    swapMixedEndianFloat(t2);
    assert( sizeof(r1)==sizeof(t2) && memcmp(&r1, &t2, sizeof(r1))==0 );
#endif
    assert( sizeof(x)==8 && sizeof(pMem->u.r)==8 );
    swapMixedEndianFloat(x);
    memcpy(&pMem->u.r, &x, sizeof(x));
    pMem->flags = sqlite3IsNaN(pMem->u.r) ? MEM_Null : MEM_Real;
  }
  return 8;
}